

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_hexdump(char *dst,void *_src,size_t len)

{
  char *pcVar1;
  size_t local_30;
  size_t i;
  uint8_t *src;
  size_t len_local;
  void *_src_local;
  char *dst_local;
  
  _src_local = dst;
  for (local_30 = 0; local_30 != len; local_30 = local_30 + 1) {
    pcVar1 = (char *)((long)_src_local + 1);
    *(char *)_src_local = "0123456789abcdef"[(int)(uint)*(byte *)((long)_src + local_30) >> 4];
    _src_local = (void *)((long)_src_local + 2);
    *pcVar1 = "0123456789abcdef"[(int)(*(byte *)((long)_src + local_30) & 0xf)];
  }
  *(undefined1 *)_src_local = 0;
  return;
}

Assistant:

void ptls_hexdump(char *dst, const void *_src, size_t len)
{
    const uint8_t *src = _src;
    size_t i;

    for (i = 0; i != len; ++i) {
        *dst++ = "0123456789abcdef"[src[i] >> 4];
        *dst++ = "0123456789abcdef"[src[i] & 0xf];
    }
    *dst++ = '\0';
}